

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<double>::default_cost_type
          (default_cost_type<double> *this,objective_function *obj_,int n)

{
  double *pdVar1;
  pointer poVar2;
  double *pdVar3;
  pointer poVar4;
  long lVar5;
  
  this->obj = obj_;
  std::make_unique<double[]>((size_t)&this->linear_elements);
  pdVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  poVar4 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (poVar4 == poVar2) {
      return;
    }
    lVar5 = (long)poVar4->variable_index;
    if ((lVar5 < 0) || (n <= poVar4->variable_index)) break;
    pdVar3 = &poVar4->factor;
    poVar4 = poVar4 + 1;
    pdVar1[lVar5] = *pdVar3 + pdVar1[lVar5];
  }
  details::fail_fast("Postcondition","0 <= elem.variable_index && elem.variable_index < n",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                     ,"1011");
}

Assistant:

default_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        for (const auto& elem : obj.elements) {
            bx_ensures(0 <= elem.variable_index && elem.variable_index < n);

            linear_elements[elem.variable_index] +=
              static_cast<Float>(elem.factor);
        }
    }